

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O2

void substcap(luaL_Buffer *b,CapState *cs)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  Capture *pCVar4;
  char *s;
  
  pCVar4 = cs->cap;
  s = pCVar4->s;
  if (pCVar4->siz == 0) {
    pCVar4 = pCVar4 + 1;
    cs->cap = pCVar4;
    while( true ) {
      bVar1 = pCVar4->kind;
      pcVar2 = pCVar4->s;
      luaL_addlstring(b,s,(long)pcVar2 - (long)s);
      if (bVar1 == '\0') break;
      iVar3 = addonestring(b,cs,"replacement");
      pCVar4 = cs->cap;
      s = pcVar2;
      if (iVar3 != 0) {
        s = pCVar4[-1].s + ((ulong)pCVar4[-1].siz - 1);
      }
    }
  }
  else {
    luaL_addlstring(b,s,(ulong)(pCVar4->siz - 1));
  }
  cs->cap = cs->cap + 1;
  return;
}

Assistant:

static void substcap (luaL_Buffer *b, CapState *cs) {
  const char *curr = cs->cap->s;
  if (isfullcap(cs->cap))  /* no nested captures? */
    luaL_addlstring(b, curr, cs->cap->siz - 1);  /* keep original text */
  else {
    cs->cap++;  /* skip open entry */
    while (!isclosecap(cs->cap)) {  /* traverse nested captures */
      const char *next = cs->cap->s;
      luaL_addlstring(b, curr, next - curr);  /* add text up to capture */
      if (addonestring(b, cs, "replacement"))
        curr = closeaddr(cs->cap - 1);  /* continue after match */
      else  /* no capture value */
        curr = next;  /* keep original text in final result */
    }
    luaL_addlstring(b, curr, cs->cap->s - curr);  /* add last piece of text */
  }
  cs->cap++;  /* go to next capture */
}